

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O2

ReturnStruct * __thiscall
miniros::master::RegistrationManager::unregisterObject
          (ReturnStruct *__return_storage_ptr__,RegistrationManager *this,Registrations *r,
          string *key,string *caller_id,string *caller_api,string *service_api)

{
  bool bVar1;
  size_type sVar2;
  __shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ostream *poVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
  *this_00;
  XmlRpcValue local_250;
  XmlRpcValue local_240;
  shared_ptr<miniros::master::NodeRef> node_ref;
  string local_1f8;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  ::std::mutex::lock(&this->m_guard);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"",(allocator<char> *)&ss);
  local_240._type = TypeInvalid;
  local_240._value.asDouble = 0.0;
  ReturnStruct::ReturnStruct(__return_storage_ptr__,1,&local_1d8,&local_240);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_240);
  ::std::__cxx11::string::~string((string *)&local_1d8);
  this_00 = &this->m_nodes;
  sVar2 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
          ::count(this_00,caller_id);
  if (sVar2 == 0) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar4 = ::std::operator<<(local_1a8,"[");
    poVar4 = ::std::operator<<(poVar4,(string *)caller_id);
    ::std::operator<<(poVar4,"] is not a registered node");
    ::std::__cxx11::stringbuf::str();
    local_250._type = TypeInt;
    local_250._value.asInt = 1;
    ReturnStruct::ReturnStruct((ReturnStruct *)&node_ref,0,&local_1f8,&local_250);
    ReturnStruct::operator=(__return_storage_ptr__,(ReturnStruct *)&node_ref);
    ReturnStruct::~ReturnStruct((ReturnStruct *)&node_ref);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&local_250);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  else {
    p_Var3 = &::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
              ::operator[](this_00,caller_id)->
              super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>;
    ::std::__shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>,
               p_Var3);
    Registrations::unregisterObj((ReturnStruct *)&ss,r,key,caller_id,caller_api,service_api);
    ReturnStruct::operator=(__return_storage_ptr__,(ReturnStruct *)&ss);
    ReturnStruct::~ReturnStruct((ReturnStruct *)&ss);
    if (__return_storage_ptr__->statusCode == 1) {
      NodeRef::remove(node_ref.
                      super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(char *)(ulong)r->m_type);
    }
    bVar1 = NodeRef::is_empty(node_ref.
                              super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
    if (bVar1) {
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
      ::erase(&this_00->_M_t,caller_id);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_guard);
  return __return_storage_ptr__;
}

Assistant:

ReturnStruct RegistrationManager::unregisterObject(Registrations& r, const std::string& key,
  const std::string& caller_id, const std::string& caller_api, const std::string& service_api)
{
  std::scoped_lock<std::mutex> lock(m_guard);

  ReturnStruct ret;
  if (m_nodes.count(caller_id)) {
    std::shared_ptr<NodeRef> node_ref = m_nodes[caller_id];
    ret = r.unregisterObj(key, caller_id, caller_api, service_api);
    if (ret.statusCode == 1) {
      node_ref->remove(r.type(), key);
    }
    if (node_ref->is_empty()) {
      m_nodes.erase(caller_id);
    }
  } else {
    std::stringstream ss;
    ss << "[" << caller_id << "] is not a registered node";
    ret = ReturnStruct(0, ss.str(), RpcValue(1));
  }
  return ret;
}